

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communicator.cpp
# Opt level: O1

void __thiscall GGSock::Communicator::Data::doSend(Data *this)

{
  bool bVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  uint uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  ulong uVar7;
  short local_4a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  _Any_data *local_40;
  TSocketDescriptor *local_38;
  
  pbVar6 = (this->ringBufferSend)._M_elems + this->rbHead;
  uVar5 = (uint)(this->ringBufferSend)._M_elems[this->rbHead]._M_string_length;
  local_38 = &this->sd;
  local_40 = (_Any_data *)&this->errorCallback;
  uVar7 = 0;
  local_48 = pbVar6;
  do {
    if (uVar5 == 0) break;
    sVar3 = ::send(this->sdpeer,(pbVar6->_M_dataplus)._M_p + uVar7,(ulong)uVar5,0);
    iVar2 = (int)sVar3;
    if (iVar2 < 0) {
      piVar4 = __errno_location();
      if (*piVar4 == 0xb) {
        bVar1 = false;
        pbVar6 = local_48;
      }
      else {
        this->isConnected = false;
        anon_unknown.dwarf_783c::closeAndReset(&this->sdpeer);
        anon_unknown.dwarf_783c::closeAndReset(local_38);
        bVar1 = true;
        pbVar6 = local_48;
        if ((this->errorCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
          local_4a = (short)*piVar4;
          (*(this->errorCallback)._M_invoker)(local_40,&local_4a);
          pbVar6 = local_48;
        }
      }
    }
    else {
      uVar5 = uVar5 - iVar2;
      uVar7 = (ulong)(uint)((int)uVar7 + iVar2);
      bVar1 = false;
    }
  } while (!bVar1);
  iVar2 = 0;
  if (this->rbHead < 0x7f) {
    iVar2 = this->rbHead + 1;
  }
  this->rbHead = iVar2;
  return;
}

Assistant:

void doSend() {
            const auto & curMessage = ringBufferSend[rbHead];
            TBufferSize size = (TBufferSize) curMessage.size();

            int offset = 0;
            while (size > 0) {
                int rc = (int) ::send(sdpeer, curMessage.data() + offset, size, 0);
                if (rc < 0) {
                    if (e_wouldBlock() == false) {
                        isConnected = false;
                        ::closeAndReset(sdpeer);
                        ::closeAndReset(sd);

                        if (errorCallback) {
                            TErrorCode errorCode = errno;
                            errorCallback(errorCode);
                        }

                        break;
                    }
                    continue;
                }
                size -= rc;
                offset += rc;
            }

            if (++rbHead >= (int) ringBufferSend.size()) {
                rbHead = 0;
            }
        }